

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2protocol.cpp
# Opt level: O2

void Http2::appendProtocolUpgradeHeaders(QHttp2Configuration *config,QHttpNetworkRequest *request)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char> local_c0;
  QArrayDataPointer<char> local_a8;
  QByteArrayView local_88;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qVar1 = QByteArrayView::lengthHelperCharArray("Connection",0xb);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[9])
            (&local_58,request,qVar1,"Connection",&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    local_88.m_size = 0;
    local_88.m_data = (char *)0x0;
  }
  else {
    local_88.m_size = QByteArrayView::lengthHelperCharArray(", ",3);
    local_88.m_data = ", ";
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char *)&local_88;
  local_a8.size = 0x249549;
  local_a8.d = (Data *)&local_58;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&>,_const_char_(&)[24]>::
  convertTo<QByteArray>
            ((QByteArray *)&local_78,
             (QStringBuilder<QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&>,_const_char_(&)[24]>
              *)&local_a8);
  QByteArray::QByteArray((QByteArray *)&local_a8,"Connection",-1);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_a8,&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  QByteArray::QByteArray((QByteArray *)&local_a8,"Upgrade",-1);
  QByteArray::QByteArray((QByteArray *)&local_c0,"h2c",-1);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_a8,&local_c0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  configurationToSettingsFrame((Frame *)&local_a8,config);
  QByteArray::QByteArray((QByteArray *)&local_c0,"HTTP2-Settings",-1);
  settingsFrameToBase64((QByteArray *)&local_d8,(Frame *)&local_a8);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_c0,&local_d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendProtocolUpgradeHeaders(const QHttp2Configuration &config, QHttpNetworkRequest *request)
{
    Q_ASSERT(request);
    // RFC 2616, 14.10
    // RFC 7540, 3.2
    const QByteArray connectionHeader = request->headerField("Connection");
    const auto separator = connectionHeader.isEmpty() ? QByteArrayView() : QByteArrayView(", ");
    // We _append_ 'Upgrade':
    QByteArray value = connectionHeader + separator + "Upgrade, HTTP2-Settings";
    request->setHeaderField("Connection", value);
    // This we just (re)write.
    request->setHeaderField("Upgrade", "h2c");

    const Frame frame(configurationToSettingsFrame(config));
    // This we just (re)write.
    request->setHeaderField("HTTP2-Settings", settingsFrameToBase64(frame));
}